

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  TestCaseTracker *pTVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool _missingAssertions;
  uint uVar9;
  _Rb_tree_node_base *p_Var10;
  RunState RVar11;
  Guard guard;
  SectionInfo testCaseSection;
  StreamRedirect cerrRedir;
  SectionStats testCaseSectionStats;
  string local_508;
  size_t local_4e8;
  size_t sStack_4e0;
  SectionInfo local_4d0;
  undefined1 local_468 [408];
  undefined1 local_2d0 [48];
  char local_2a0 [24];
  _Alloc_hider local_288;
  char local_278 [16];
  Flags local_268;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&local_4d0,_lineInfo,(string *)_name,&(_name->super_TestCaseInfo).description);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,&local_4d0);
  local_4e8 = (this->m_totals).assertions.passed;
  sStack_4e0 = (this->m_totals).assertions.failed;
  sVar3 = (this->m_totals).assertions.failedButOk;
  local_468._0_8_ = local_468 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"TEST_CASE","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_2d0,(string *)local_468,_lineInfo,&local_508,Normal);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_2d0);
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).lineInfo,(string *)(local_2d0 + 0x20));
  (this->m_lastAssertionInfo).lineInfo.line = local_2a0._16_8_;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_288);
  (this->m_lastAssertionInfo).resultDisposition = local_268;
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if ((char *)local_2d0._32_8_ != local_2a0) {
    operator_delete((void *)local_2d0._32_8_);
  }
  if ((undefined1 *)CONCAT44(local_2d0._4_4_,local_2d0._0_4_) != local_2d0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_2d0._4_4_,local_2d0._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
    operator_delete((void *)local_468._0_8_);
  }
  pTVar4 = (this->m_testCaseTracker).nullableValue;
  pTVar4->m_currentSection = &pTVar4->m_testCase;
  pTVar4->m_completedASectionThisRun = false;
  if ((pTVar4->m_testCase).m_runState == NotStarted) {
    (pTVar4->m_testCase).m_runState = Executing;
  }
  local_508._M_dataplus._M_p = (pointer)pTVar4;
  gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
  uVar8 = local_2d0._8_4_;
  uVar7 = local_2d0._0_4_;
  uVar9 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar9 & 1) == 0) {
    invokeActiveTestCase(this);
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_2d0,(ostream *)&std::cout,redirectedCout)
    ;
    StreamRedirect::StreamRedirect((StreamRedirect *)local_468,(ostream *)&std::cerr,redirectedCerr)
    ;
    invokeActiveTestCase(this);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_468);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_2d0);
  }
  gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
  p_Var10 = (pTVar4->m_testCase).m_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RVar11 = Completed;
  do {
    if ((_Rb_tree_header *)p_Var10 ==
        &(pTVar4->m_testCase).m_children._M_t._M_impl.super__Rb_tree_header) {
LAB_001873f7:
      (pTVar4->m_testCase).m_runState = RVar11;
      handleUnfinishedSections(this);
      std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
                (&this->m_messages,
                 (this->m_messages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_start);
      local_468._0_8_ = (this->m_totals).assertions.passed - local_4e8;
      local_468._8_8_ = (this->m_totals).assertions.failed - sStack_4e0;
      local_468._16_8_ = (this->m_totals).assertions.failedButOk - sVar3;
      _missingAssertions = testForMissingAssertions(this,(Counts *)local_468);
      uVar6 = local_468._16_8_;
      uVar5 = local_468._8_8_;
      if (((_name->super_TestCaseInfo).properties & (MayFail|ShouldFail)) != None) {
        local_468._16_8_ = local_468._8_8_;
        local_468._8_8_ = uVar6;
        psVar1 = &(this->m_totals).assertions.failed;
        *psVar1 = *psVar1 - uVar5;
        psVar1 = &(this->m_totals).assertions.failedButOk;
        *psVar1 = (size_t)(uVar5 + *psVar1);
      }
      SectionStats::SectionStats
                ((SectionStats *)local_2d0,&local_4d0,(Counts *)local_468,
                 (double)(uint)((local_2d0._8_4_ - uVar8) + (local_2d0._0_4_ - uVar7) * 1000000) /
                 1000000.0,_missingAssertions);
      pIVar2 = (this->m_reporter).m_p;
      (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,local_2d0);
      SectionStats::~SectionStats((SectionStats *)local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0.lineInfo.file._M_dataplus._M_p != &local_4d0.lineInfo.file.field_2) {
        operator_delete(local_4d0.lineInfo.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0.description._M_dataplus._M_p != &local_4d0.description.field_2) {
        operator_delete(local_4d0.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0.name._M_dataplus._M_p != &local_4d0.name.field_2) {
        operator_delete(local_4d0.name._M_dataplus._M_p);
      }
      return;
    }
    if (p_Var10[3]._M_color != 3) {
      RVar11 = ExecutingChildren;
      goto LAB_001873f7;
    }
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                makeUnexpectedResultBuilder().useActiveException();
            }
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }